

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec3.h
# Opt level: O2

void __thiscall
Camera::Camera(Camera *this,Vec3 *origin,Vec3 *lower_left_corner,Vec3 *horizontal,Vec3 *vertical)

{
  (this->m_origin).e[0] = origin->e[0];
  (this->m_origin).e[1] = origin->e[1];
  (this->m_origin).e[2] = origin->e[2];
  (this->m_lower_left_corner).e[0] = lower_left_corner->e[0];
  (this->m_lower_left_corner).e[1] = lower_left_corner->e[1];
  (this->m_lower_left_corner).e[2] = lower_left_corner->e[2];
  (this->m_horizontal).e[0] = horizontal->e[0];
  (this->m_horizontal).e[1] = horizontal->e[1];
  (this->m_horizontal).e[2] = horizontal->e[2];
  (this->m_vertical).e[0] = vertical->e[0];
  (this->m_vertical).e[1] = vertical->e[1];
  (this->m_vertical).e[2] = vertical->e[2];
  return;
}

Assistant:

inline float        operator[](int i) const { return e[i]; }